

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase576::run(TestCase576 *this)

{
  StructDataBitCount *this_00;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  bool bVar1;
  Iterator IVar2;
  undefined8 in_stack_fffffffffffff960;
  WirePointer *in_stack_fffffffffffff968;
  Reader local_628;
  Reader local_5f8;
  RawBrandedSchema *local_5c8;
  Schema SStack_5c0;
  uint local_5b8;
  undefined4 uStack_5b4;
  SegmentReader *pSStack_5b0;
  CapTableReader *local_5a8;
  void *pvStack_5a0;
  WirePointer *local_598;
  StructDataBitCount SStack_590;
  StructPointerCount SStack_58c;
  undefined2 uStack_58a;
  Orphan<capnp::DynamicValue> local_580;
  RawBrandedSchema *local_548;
  Schema SStack_540;
  uint local_538;
  undefined4 uStack_534;
  SegmentReader *pSStack_530;
  CapTableReader *local_528;
  void *pvStack_520;
  WirePointer *local_518;
  StructDataBitCount SStack_510;
  StructPointerCount SStack_50c;
  undefined2 uStack_50a;
  undefined1 auStack_500 [8];
  Field field_1;
  undefined1 local_4b0 [8];
  Iterator __end2_1;
  undefined1 local_490 [8];
  Iterator __begin2_1;
  FieldList local_478;
  FieldList *local_440;
  FieldList *__range2_1;
  CapTableReader *pCStack_430;
  void *local_428;
  WirePointer *pWStack_420;
  undefined8 local_418;
  int iStack_410;
  undefined2 uStack_40c;
  undefined2 uStack_40a;
  Reader local_408;
  RawBrandedSchema *local_3d8;
  Schema SStack_3d0;
  uint local_3c8;
  undefined4 uStack_3c4;
  SegmentReader *pSStack_3c0;
  CapTableReader *local_3b8;
  void *pvStack_3b0;
  WirePointer *local_3a8;
  StructDataBitCount SStack_3a0;
  StructPointerCount SStack_39c;
  undefined2 uStack_39a;
  Orphan<capnp::DynamicValue> local_390;
  RawBrandedSchema *local_358;
  Schema SStack_350;
  uint local_348;
  undefined4 uStack_344;
  SegmentReader *pSStack_340;
  CapTableReader *local_338;
  void *pvStack_330;
  WirePointer *local_328;
  StructDataBitCount SStack_320;
  StructPointerCount SStack_31c;
  undefined2 uStack_31a;
  undefined1 auStack_318 [8];
  Field field;
  undefined1 local_2c8 [8];
  Iterator __end2;
  undefined1 local_2a8 [8];
  Iterator __begin2;
  FieldList local_290;
  FieldList *local_258;
  FieldList *__range2;
  Builder dynamicDst;
  Builder dynamic;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> dst;
  Orphanage local_198;
  undefined1 local_188 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> dstOrphan;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase576 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  dstOrphan.builder.location = (word *)auStack_128;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffff960;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffff960 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffff960 >> 0x30);
  initTestMessage(builder_00);
  builder_01._builder.capTable = root._builder.capTable;
  builder_01._builder.segment = root._builder.segment;
  builder_01._builder.data = root._builder.data;
  builder_01._builder.pointers = root._builder.pointers;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffff960;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffff960 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffff960 >> 0x30);
  local_198 = Orphanage::getForMessageContaining<capnproto_test::capnp::test::TestAllTypes::Builder>
                        (builder_01);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188,&local_198);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&dynamic.builder.dataSize,
             (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188);
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder&,void>
            ((Builder *)&dynamicDst.builder.dataSize,(Builder *)auStack_128);
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder&,void>
            ((Builder *)&__range2,(Builder *)&dynamic.builder.dataSize);
  __begin2._8_8_ = DynamicStruct::Builder::getSchema((Builder *)&dynamicDst.builder.dataSize);
  StructSchema::getFields(&local_290,(StructSchema *)&__begin2.index);
  local_258 = &local_290;
  IVar2 = StructSchema::FieldList::begin(local_258);
  __end2._8_8_ = IVar2.container;
  __begin2.container._0_4_ = IVar2.index;
  local_2a8 = (undefined1  [8])__end2._8_8_;
  IVar2 = StructSchema::FieldList::end(local_258);
  field.proto._reader._40_8_ = IVar2.container;
  __end2.container._0_4_ = IVar2.index;
  local_2c8 = (undefined1  [8])field.proto._reader._40_8_;
  while( true ) {
    bVar1 = IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
            operator==((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_2a8,
                       (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_2c8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              ((Field *)auStack_318,
               (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_2a8);
    local_328 = field.proto._reader.pointers;
    SStack_320 = field.proto._reader.dataSize;
    SStack_31c = field.proto._reader.pointerCount;
    uStack_31a = field.proto._reader._38_2_;
    local_338 = field.proto._reader.capTable;
    pvStack_330 = field.proto._reader.data;
    local_348 = field.index;
    uStack_344 = field._12_4_;
    pSStack_340 = field.proto._reader.segment;
    local_358 = (RawBrandedSchema *)auStack_318;
    SStack_350 = field.parent.super_Schema.raw;
    local_3a8 = field.proto._reader.pointers;
    SStack_3a0 = field.proto._reader.dataSize;
    SStack_39c = field.proto._reader.pointerCount;
    uStack_39a = field.proto._reader._38_2_;
    local_3b8 = field.proto._reader.capTable;
    pvStack_3b0 = field.proto._reader.data;
    local_3c8 = field.index;
    uStack_3c4 = field._12_4_;
    pSStack_3c0 = field.proto._reader.segment;
    local_3d8 = (RawBrandedSchema *)auStack_318;
    SStack_3d0 = field.parent.super_Schema.raw;
    field_00._8_8_ = field.parent.super_Schema.raw;
    field_00.parent.super_Schema.raw = (Schema)(Schema)auStack_318;
    field_00.proto._reader.segment = (SegmentReader *)field._8_8_;
    field_00.proto._reader.capTable = (CapTableReader *)field.proto._reader.segment;
    field_00.proto._reader.data = field.proto._reader.capTable;
    field_00.proto._reader.pointers = (WirePointer *)field.proto._reader.data;
    field_00.proto._reader._32_8_ = field.proto._reader.pointers;
    field_00.proto._reader.nestingLimit = field.proto._reader.dataSize;
    field_00.proto._reader._44_2_ = field.proto._reader.pointerCount;
    field_00.proto._reader._46_2_ = field.proto._reader._38_2_;
    DynamicStruct::Builder::disown(&local_390,(Builder *)&dynamicDst.builder.dataSize,field_00);
    field_01._8_8_ = SStack_350.raw;
    field_01.parent.super_Schema.raw = (Schema)(Schema)local_358;
    field_01.proto._reader.segment = (SegmentReader *)_local_348;
    field_01.proto._reader.capTable = (CapTableReader *)pSStack_340;
    field_01.proto._reader.data = local_338;
    field_01.proto._reader.pointers = (WirePointer *)pvStack_330;
    field_01.proto._reader._32_8_ = local_328;
    field_01.proto._reader.nestingLimit = SStack_320;
    field_01.proto._reader._44_2_ = SStack_31c;
    field_01.proto._reader._46_2_ = uStack_31a;
    in_stack_fffffffffffff968 = local_328;
    DynamicStruct::Builder::adopt((Builder *)&__range2,field_01,&local_390);
    Orphan<capnp::DynamicValue>::~Orphan(&local_390);
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator++
              ((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_2a8);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_408,(Builder *)auStack_128);
  reader._reader.capTable = (CapTableReader *)local_408._reader.data;
  reader._reader.segment = (SegmentReader *)local_408._reader.capTable;
  reader._reader.data = local_408._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_408._reader._32_8_;
  reader._reader.dataSize = local_408._reader.nestingLimit;
  reader._reader.pointerCount = local_408._reader._44_2_;
  reader._reader._38_2_ = local_408._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffff968;
  checkTestMessageAllZero(reader);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)&__range2_1,(Builder *)&dynamic.builder.dataSize);
  reader_00._reader.capTable = (CapTableReader *)local_428;
  reader_00._reader.segment = (SegmentReader *)pCStack_430;
  reader_00._reader.data = pWStack_420;
  reader_00._reader.pointers = (WirePointer *)local_418;
  reader_00._reader.dataSize = iStack_410;
  reader_00._reader.pointerCount = uStack_40c;
  reader_00._reader._38_2_ = uStack_40a;
  reader_00._reader._40_8_ = in_stack_fffffffffffff968;
  checkTestMessage(reader_00);
  __begin2_1._8_8_ = DynamicStruct::Builder::getSchema((Builder *)&dynamicDst.builder.dataSize);
  StructSchema::getFields(&local_478,(StructSchema *)&__begin2_1.index);
  local_440 = &local_478;
  IVar2 = StructSchema::FieldList::begin(local_440);
  __end2_1._8_8_ = IVar2.container;
  __begin2_1.container._0_4_ = IVar2.index;
  local_490 = (undefined1  [8])__end2_1._8_8_;
  IVar2 = StructSchema::FieldList::end(local_440);
  field_1.proto._reader._40_8_ = IVar2.container;
  __end2_1.container._0_4_ = IVar2.index;
  local_4b0 = (undefined1  [8])field_1.proto._reader._40_8_;
  while( true ) {
    bVar1 = IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
            operator==((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_490,
                       (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                        *)local_4b0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              ((Field *)auStack_500,
               (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_490);
    local_518 = field_1.proto._reader.pointers;
    SStack_510 = field_1.proto._reader.dataSize;
    SStack_50c = field_1.proto._reader.pointerCount;
    uStack_50a = field_1.proto._reader._38_2_;
    local_528 = field_1.proto._reader.capTable;
    pvStack_520 = field_1.proto._reader.data;
    local_538 = field_1.index;
    uStack_534 = field_1._12_4_;
    pSStack_530 = field_1.proto._reader.segment;
    local_548 = (RawBrandedSchema *)auStack_500;
    SStack_540 = field_1.parent.super_Schema.raw;
    local_598 = field_1.proto._reader.pointers;
    SStack_590 = field_1.proto._reader.dataSize;
    SStack_58c = field_1.proto._reader.pointerCount;
    uStack_58a = field_1.proto._reader._38_2_;
    local_5a8 = field_1.proto._reader.capTable;
    pvStack_5a0 = field_1.proto._reader.data;
    local_5b8 = field_1.index;
    uStack_5b4 = field_1._12_4_;
    pSStack_5b0 = field_1.proto._reader.segment;
    local_5c8 = (RawBrandedSchema *)auStack_500;
    SStack_5c0 = field_1.parent.super_Schema.raw;
    field_02._8_8_ = field_1.parent.super_Schema.raw;
    field_02.parent.super_Schema.raw = (Schema)(Schema)auStack_500;
    field_02.proto._reader.segment = (SegmentReader *)field_1._8_8_;
    field_02.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
    field_02.proto._reader.data = field_1.proto._reader.capTable;
    field_02.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
    field_02.proto._reader._32_8_ = field_1.proto._reader.pointers;
    field_02.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
    field_02.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
    field_02.proto._reader._46_2_ = field_1.proto._reader._38_2_;
    DynamicStruct::Builder::disown(&local_580,(Builder *)&dynamicDst.builder.dataSize,field_02);
    field_03._8_8_ = SStack_540.raw;
    field_03.parent.super_Schema.raw = (Schema)(Schema)local_548;
    field_03.proto._reader.segment = (SegmentReader *)_local_538;
    field_03.proto._reader.capTable = (CapTableReader *)pSStack_530;
    field_03.proto._reader.data = local_528;
    field_03.proto._reader.pointers = (WirePointer *)pvStack_520;
    field_03.proto._reader._32_8_ = local_518;
    field_03.proto._reader.nestingLimit = SStack_510;
    field_03.proto._reader._44_2_ = SStack_50c;
    field_03.proto._reader._46_2_ = uStack_50a;
    in_stack_fffffffffffff968 = local_518;
    DynamicStruct::Builder::adopt((Builder *)&__range2,field_03,&local_580);
    Orphan<capnp::DynamicValue>::~Orphan(&local_580);
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator++
              ((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_490);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_5f8,(Builder *)auStack_128);
  reader_01._reader.capTable = (CapTableReader *)local_5f8._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_5f8._reader.capTable;
  reader_01._reader.data = local_5f8._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_5f8._reader._32_8_;
  reader_01._reader.dataSize = local_5f8._reader.nestingLimit;
  reader_01._reader.pointerCount = local_5f8._reader._44_2_;
  reader_01._reader._38_2_ = local_5f8._reader._46_2_;
  reader_01._reader._40_8_ = in_stack_fffffffffffff968;
  checkTestMessageAllZero(reader_01);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            (&local_628,(Builder *)&dynamic.builder.dataSize);
  reader_02._reader.capTable = (CapTableReader *)local_628._reader.data;
  reader_02._reader.segment = (SegmentReader *)local_628._reader.capTable;
  reader_02._reader.data = local_628._reader.pointers;
  reader_02._reader.pointers = (WirePointer *)local_628._reader._32_8_;
  reader_02._reader.dataSize = local_628._reader.nestingLimit;
  reader_02._reader.pointerCount = local_628._reader._44_2_;
  reader_02._reader._38_2_ = local_628._reader._46_2_;
  reader_02._reader._40_8_ = in_stack_fffffffffffff968;
  checkTestMessageAllZero(reader_02);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, DynamicDisown) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  Orphan<TestAllTypes> dstOrphan =
      Orphanage::getForMessageContaining(root).newOrphan<TestAllTypes>();
  auto dst = dstOrphan.get();

  DynamicStruct::Builder dynamic = root;
  DynamicStruct::Builder dynamicDst = dst;

  for (auto field: dynamic.getSchema().getFields()) {
    dynamicDst.adopt(field, dynamic.disown(field));
  }

  checkTestMessageAllZero(root.asReader());
  checkTestMessage(dst.asReader());

  for (auto field: dynamic.getSchema().getFields()) {
    dynamicDst.adopt(field, dynamic.disown(field));
  }

  checkTestMessageAllZero(root.asReader());
  checkTestMessageAllZero(dst.asReader());
}